

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequencer.cpp
# Opt level: O0

void __thiscall egc::Sequencer::DIM(Sequencer *this,unsigned_short instruction)

{
  ushort address;
  pair<unsigned_short,_unsigned_short> pVar1;
  ostream *poVar2;
  element_type *peVar3;
  unsigned_short local_20;
  unsigned_short local_1c;
  unsigned_short local_16;
  unsigned_short sign;
  unsigned_short mk;
  unsigned_short k;
  unsigned_short instruction_local;
  Sequencer *this_local;
  
  address = instruction & 0x3ff;
  poVar2 = std::operator<<((ostream *)&std::cout,"DIM");
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::oct);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,address);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::dec);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  peVar3 = std::__shared_ptr_access<egc::Memory,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<egc::Memory,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      this);
  local_16 = Memory::Read(peVar3,address,0);
  if ((local_16 != 0) && (local_16 != 0x7fff)) {
    if ((local_16 & 0x4000) == 0x4000) {
      pVar1 = AddWords(local_16,1);
      local_1c = pVar1.first;
      local_16 = local_1c;
    }
    else {
      pVar1 = AddWords(local_16,0x7ffe);
      local_20 = pVar1.first;
      local_16 = local_20;
    }
  }
  peVar3 = std::__shared_ptr_access<egc::Memory,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<egc::Memory,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      this);
  Memory::Write(peVar3,address,local_16);
  return;
}

Assistant:

void egc::Sequencer::DIM (unsigned short instruction)
{
    unsigned short k = instruction & 001777u;

    std::cout << "DIM" << " " << std::oct << k << std::dec << std::endl;

    auto mk = m_Memory->Read(k);

    if (mk != 000000u && mk != 077777u)
    {
        unsigned short sign = mk & 040000u;

        if (sign == 040000u)
        {
            mk = AddWords(mk, 000001u).first;
        }
        else
        {
            mk = AddWords(mk, 077776u).first;
        }
    }

    m_Memory->Write(k, mk);
}